

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Error_target_asset_empty_string_Test::
CoinSelection_SelectCoins_Error_target_asset_empty_string_Test
          (CoinSelection_SelectCoins_Error_target_asset_empty_string_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test =
       (_func_int **)&PTR__CoinSelection_SelectCoins_Error_target_asset_empty_string_Test_003b6b38;
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Error_target_asset_empty_string)
{
  AmountMap map_target_amount;
  map_target_amount[""] = 39060180;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetFeeAsset(exp_dummy_asset_a);
  std::vector<Utxo> ret;
  EXPECT_THROW(ret = exp_selection.SelectCoins(
      map_target_amount, GetElementsUtxoList(), exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb), CfdException);
}